

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_JabDagger(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  AActor *pAVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  APowerStrength *pAVar6;
  AActor *this_00;
  char *pcVar7;
  undefined1 local_78 [8];
  FSoundID local_70;
  FSoundID local_6c;
  FName local_68;
  FName local_64;
  DAngle local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  FTranslatedLineTarget t;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0054ea51;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0054e810:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054ea51;
        }
      }
      if (numparam == 1) goto LAB_0054e890;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054ea41;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar4) {
              pcVar7 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054ea51;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054ea41;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054e890:
        iVar5 = (this_00->player->mo->super_AActor).stamina / 10;
        iVar3 = 10;
        if (iVar5 < 10) {
          iVar3 = iVar5;
        }
        iVar5 = FRandom::operator()(&pr_jabdagger);
        iVar5 = (iVar3 + 2) * (iVar5 % (iVar3 + 8));
        pAVar6 = AActor::FindInventory<APowerStrength>(this_00);
        iVar3 = iVar5 * 10;
        if (pAVar6 == (APowerStrength *)0x0) {
          iVar3 = iVar5;
        }
        iVar5 = FRandom::Random2(&pr_jabdagger);
        pAVar2 = (AActor *)((double)iVar5 * 0.02197265625 + (this_00->Angles).Yaw.Degrees);
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        local_50 = (undefined1  [8])pAVar2;
        P_AimLineAttack((AActor *)local_78,(DAngle *)this_00,80.0,(FTranslatedLineTarget *)local_50,
                        (DAngle *)0x0,(int)&local_58,(AActor *)0x0,(AActor *)0x0);
        local_64.Index = 0x84;
        local_60.Degrees = (double)pAVar2;
        FName::FName(&local_68,"StrifeSpark");
        P_LineAttack(this_00,&local_60,80.0,(DAngle *)local_78,iVar3,&local_64,&local_68,1,&t,
                     (int *)0x0);
        if (t.linetarget == (AActor *)0x0) {
          local_70.ID = S_FindSound("misc/swish");
          S_Sound(this_00,1,&local_70,1.0,1.0);
        }
        else {
          pcVar7 = "misc/metalhit";
          if ((((t.linetarget)->flags).Value >> 0x13 & 1) == 0) {
            pcVar7 = "misc/meathit";
          }
          local_6c.ID = S_FindSound(pcVar7);
          S_Sound(this_00,1,&local_6c,1.0,1.0);
          (this_00->Angles).Yaw.Degrees = t.angleFromSource.Degrees;
          *(byte *)&(this_00->flags).Value = (byte)(this_00->flags).Value | 0x80;
          P_DaggerAlert(this_00,t.linetarget);
        }
        return 0;
      }
      pcVar7 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054ea51;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0054e810;
  }
LAB_0054ea41:
  pcVar7 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054ea51:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_JabDagger)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	int			power;
	FTranslatedLineTarget t;

	power = MIN(10, self->player->mo->stamina / 10);
	damage = (pr_jabdagger() % (power + 8)) * (power + 2);

	if (self->FindInventory<APowerStrength>())
	{
		damage *= 10;
	}

	angle = self->Angles.Yaw + pr_jabdagger.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, 80.);
	P_LineAttack (self, angle, 80., pitch, damage, NAME_Melee, "StrifeSpark", true, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON,
			t.linetarget->flags & MF_NOBLOOD ? "misc/metalhit" : "misc/meathit",
			1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
		self->flags |= MF_JUSTATTACKED;
		P_DaggerAlert (self, t.linetarget);
	}
	else
	{
		S_Sound (self, CHAN_WEAPON, "misc/swish", 1, ATTN_NORM);
	}
	return 0;
}